

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::JavascriptProxy::GetSetter
          (JavascriptProxy *this,JavascriptString *propertyNameString,Var *setterValueOrProxy,
          PropertyValueInfo *info,ScriptContext *requestContext)

{
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValueOrProxy_local;
  JavascriptString *propertyNameString_local;
  JavascriptProxy *this_local;
  
  *setterValueOrProxy = this;
  PropertyValueInfo::SetNoCache(info,(RecyclableObject *)this);
  PropertyValueInfo::DisablePrototypeCache(info,(RecyclableObject *)this);
  return Proxy;
}

Assistant:

DescriptorFlags JavascriptProxy::GetSetter(JavascriptString* propertyNameString, Var* setterValueOrProxy, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        *setterValueOrProxy = this;
        PropertyValueInfo::SetNoCache(info, this);
        PropertyValueInfo::DisablePrototypeCache(info, this); // We can't cache prototype property either
        return DescriptorFlags::Proxy;
    }